

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<32,151>::
GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeReichMooreBlock,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore>
::GeneralCovarianceBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeReichMooreBlock,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore>
           *this,ControlRecord *cont,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  double ap;
  double spi;
  long lVar1;
  _Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
  local_c8;
  ReichMooreScatteringRadiusUncertainties local_78;
  
  ap = (cont->
       super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
       ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  spi = (cont->
        super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
        ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Head_base<0UL,_double,_false>._M_head_impl;
  lVar1 = *(long *)&(cont->
                    super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                    ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>;
  if (lVar1 == 0) {
    local_c8._M_engaged = false;
  }
  else {
    ReichMooreScatteringRadiusUncertainties::
    ReichMooreScatteringRadiusUncertainties<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((ReichMooreScatteringRadiusUncertainties *)&local_78,it,end,lineNumber,MAT,MF,MT);
    std::optional<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>::
    optional<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true>
              ((optional<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
                *)&local_c8,&local_78);
  }
  GeneralCovarianceBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (this,spi,ap,
             (optional<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
              *)&local_c8,
             (uint)((_Head_base<4UL,_long,_false> *)
                   ((long)&(cont->
                           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                           ).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Tuple_impl<3UL,_long,_long,_long>.
                           super__Tuple_impl<4UL,_long,_long> + 8))->_M_head_impl,it,end,lineNumber,
             MAT,MF,MT);
  std::
  _Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
  ::_M_reset(&local_c8);
  if (lVar1 != 0) {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_78.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>);
  }
  return;
}

Assistant:

GeneralCovarianceBase( ControlRecord&& cont,
                       Iterator& it, const Iterator& end, long& lineNumber,
                       int MAT, int MF, int MT ) :
  // no try ... catch: exceptions will be handled in the derived class
  GeneralCovarianceBase( cont.C1(), cont.C2(),
                         cont.N2()
                           ? std::make_optional(
                                    Derived::read( it, end, lineNumber,
                                                   MAT, MF, MT ) )
                           : std::nullopt,
                         cont.N1(),
                         it, end, lineNumber, MAT, MF, MT ) {}